

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPDependClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDependClause *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *pvVar2;
  OpenMPDependClauseModifier OVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar4;
  pointer ppcVar5;
  long lVar6;
  pointer pcVar7;
  long *plVar8;
  int iVar9;
  pointer ppvVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong extraout_RDX;
  uint uVar13;
  OpenMPDependClauseType OVar14;
  ulong uVar15;
  string clause_string;
  allocator<char> local_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long *local_80;
  ulong local_78;
  long local_70 [2];
  string local_60;
  ulong local_40;
  OpenMPDependClause *local_38;
  
  OVar3 = this->modifier;
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"depend ","");
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"(","");
  OVar14 = this->type;
  if (OVar3 == OMPC_DEPEND_MODIFIER_iterator) {
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::append((char *)&local_80);
    pvVar2 = &this->depend_iterators_definition_class;
    ppvVar10 = (pvVar2->
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_88 = paVar1;
    local_40 = (ulong)OVar14;
    local_38 = this;
    if ((this->depend_iterators_definition_class).
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppvVar10) {
      uVar13 = 1;
      uVar15 = 0;
      do {
        if ((ppvVar10[uVar15]->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
            _M_impl.super__Vector_impl_data._M_finish ==
            (ppvVar10[uVar15]->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start) {
LAB_0017ae32:
          uVar15 = 0;
          uVar12 = 0;
          goto LAB_0017ae6e;
        }
        std::__cxx11::string::append((char *)&local_80);
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->depend_iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3;
        if (uVar12 <= uVar15) goto LAB_0017ae6e;
        pvVar4 = ppvVar10[uVar15];
        ppcVar5 = (pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                     _M_impl.super__Vector_impl_data + 8) == ppcVar5) goto LAB_0017ae32;
        if (**ppcVar5 != '\0') {
          std::__cxx11::string::append((char *)&local_80);
        }
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->depend_iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3;
        if (uVar12 <= uVar15) goto LAB_0017ae6e;
        pvVar4 = ppvVar10[uVar15];
        uVar12 = (long)*(pointer *)
                        ((long)&(pvVar4->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar12 < 2) {
          uVar15 = 1;
          goto LAB_0017ae6e;
        }
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::append((char *)&local_80);
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->depend_iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3;
        if (uVar12 <= uVar15) goto LAB_0017ae6e;
        pvVar4 = ppvVar10[uVar15];
        uVar12 = (long)*(pointer *)
                        ((long)&(pvVar4->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar12 < 3) {
          uVar15 = 2;
          goto LAB_0017ae6e;
        }
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::append((char *)&local_80);
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->depend_iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3;
        if (uVar12 <= uVar15) goto LAB_0017ae6e;
        pvVar4 = ppvVar10[uVar15];
        uVar12 = (long)*(pointer *)
                        ((long)&(pvVar4->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar12 < 4) {
          uVar15 = 3;
          goto LAB_0017ae6e;
        }
        std::__cxx11::string::append((char *)&local_80);
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->depend_iterators_definition_class).
                          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3) <=
            uVar15) {
LAB_0017ae57:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar15);
          uVar12 = extraout_RDX;
LAB_0017ae68:
          uVar15 = 4;
LAB_0017ae6e:
          uVar11 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,uVar15,uVar12);
          paVar1 = local_88;
          if (local_80 != local_70) {
            operator_delete(local_80,local_70[0] + 1);
          }
          plVar8 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar8 != paVar1) {
            operator_delete(plVar8,paVar1->_M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar11);
        }
        pvVar4 = ppvVar10[uVar15];
        lVar6 = *(long *)&(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pvVar4->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data + 8) - lVar6 >> 3) < 5) {
          uVar15 = 4;
          goto LAB_0017ae57;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,*(char **)(lVar6 + 0x20),&local_89);
        iVar9 = std::__cxx11::string::compare((char *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (iVar9 != 0) {
          std::__cxx11::string::append((char *)&local_80);
          ppvVar10 = (pvVar2->
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          uVar12 = (long)(this->depend_iterators_definition_class).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >> 3;
          if (uVar12 <= uVar15) goto LAB_0017ae6e;
          pvVar4 = ppvVar10[uVar15];
          uVar12 = (long)*(pointer *)
                          ((long)&(pvVar4->
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&(pvVar4->
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                             _M_impl.super__Vector_impl_data >> 3;
          if (4 < uVar12) {
            std::__cxx11::string::append((char *)&local_80);
            goto LAB_0017ac66;
          }
          goto LAB_0017ae68;
        }
LAB_0017ac66:
        std::__cxx11::string::append((char *)&local_80);
        uVar15 = (ulong)uVar13;
        ppvVar10 = (pvVar2->
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = uVar13 + 1;
      } while (uVar15 < (ulong)((long)(this->depend_iterators_definition_class).
                                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar10 >>
                               3));
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
    OVar14 = (OpenMPDependClauseType)local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_80);
    this = local_38;
  }
  if (1 < local_78) {
    std::__cxx11::string::append((char *)&local_80);
  }
  if (OVar14 < OMPC_DEPENDENCE_TYPE_unknown) {
    std::__cxx11::string::append((char *)&local_80);
  }
  if ((OVar14 != OMPC_DEPENDENCE_TYPE_source) && (1 < local_78)) {
    std::__cxx11::string::append((char *)&local_80);
  }
  if (OVar14 == OMPC_DEPENDENCE_TYPE_sink) {
    pcVar7 = (this->dependence_vector)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar7,pcVar7 + (this->dependence_vector)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_60,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_80);
  if (3 < local_78) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDependClause::toString() {
    OpenMPDependClauseModifier modifier = this->getModifier();
    std::vector<vector<const char*>* >* depend_iterators_definition_class;
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        depend_iterators_definition_class = this->getDependIteratorsDefinitionClass();
    }
    std::string result = "depend ";
    std::string clause_string = "(";

    OpenMPDependClauseType type = this->getType();
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        switch (modifier) {
            case OMPC_DEPEND_MODIFIER_iterator: {
                clause_string += "iterator";
                clause_string += " ( ";
                for (unsigned int i = 0; i < depend_iterators_definition_class->size(); i++) {
                    clause_string += depend_iterators_definition_class->at(i)->at(0);
                    if (strcmp(depend_iterators_definition_class->at(i)->at(0), "\0") != 0) {
                        clause_string += " ";
                    };
                    clause_string += depend_iterators_definition_class->at(i)->at(1);
                    clause_string += "=";
                    clause_string += depend_iterators_definition_class->at(i)->at(2);
                    clause_string += ":";
                    clause_string += depend_iterators_definition_class->at(i)->at(3);
                    if ((string)depend_iterators_definition_class->at(i)->at(4) != "") {
                        clause_string += ":";
                        clause_string += depend_iterators_definition_class->at(i)->at(4);
                    };
                    clause_string += ", ";
                };
                clause_string = clause_string.substr(0, clause_string.size()-2);

                clause_string += " )";
            }
            default:
            ;
        }
    }

    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (type) {
        case OMPC_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }

    if (clause_string.size() > 1&&type!=OMPC_DEPENDENCE_TYPE_source) {
        clause_string += " : ";

    };
    if(type==OMPC_DEPENDENCE_TYPE_sink){clause_string += this->getDependenceVector();}
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };
    return result;
}